

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fire.hpp
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
fire::arg::_convert<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,arg *this,bool dec_main_argc)

{
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  
  _get<std::__cxx11::string>(&local_48,this);
  std::__cxx11::string::string((string *)&local_88,(string *)&(this->_id)._longer);
  std::operator+(&local_68,"required argument ",&local_88);
  std::operator+(&local_a8,&local_68," not provided");
  _matcher::deferred_assert
            ((_matcher *)_storage<void>::matcher,&this->_id,local_48._exists,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  _matcher::check((_matcher *)_storage<void>::matcher,dec_main_argc);
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  local_a8._M_string_length = 0;
  local_a8.field_2._M_local_buf[0] = '\0';
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  value_or(__return_storage_ptr__,&local_48,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

T arg::_convert(bool dec_main_argc) {
        optional<T> val = _get_with_precision<T>();
        _::matcher.deferred_assert(_id, val.has_value(),
                                   "required argument " + _id.longer() + " not provided");
        _::matcher.check(dec_main_argc);
        return val.value_or(T());
    }